

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O0

double __thiscall TasGrid::RuleWavelet::eval_cubic<1>(RuleWavelet *this,int point,double x)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  byte bVar4;
  int iVar5;
  double dVar6;
  double local_98;
  double shift;
  double value;
  double scale;
  int subindex;
  double *phi_2;
  double *phi_1;
  int l;
  double *phi;
  double sgn;
  double x_local;
  int point_local;
  RuleWavelet *this_local;
  
  if (((point != 0) || (x != 0.0)) || (NAN(x))) {
    phi = (double *)0x3ff0000000000000;
    sgn = x;
    x_local._4_4_ = point;
    if (point < 5) {
      if (point == 2) {
        x_local._4_4_ = 1;
        phi = (double *)0xbff0000000000000;
        sgn = -x;
      }
      else if (point == 4) {
        x_local._4_4_ = 3;
        phi = (double *)0xbff0000000000000;
        sgn = -x;
      }
      pvVar2 = ::std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->data,1);
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar2,(long)(((x_local._4_4_ + 1) / 2) * this->num_data_points));
      dVar6 = interpolate<1>(this,pvVar3,sgn);
      this_local = (RuleWavelet *)((double)phi * dVar6);
    }
    else {
      iVar1 = Maths::intlog2(point + -1);
      if (iVar1 == 2) {
        if (6 < point) {
          sgn = -x;
          phi = (double *)0xbff0000000000000;
          x_local._4_4_ = 0xd - point;
        }
        pvVar2 = ::std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->data,2);
        pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar2,(long)((x_local._4_4_ + -5) * this->num_data_points));
        dVar6 = interpolate<1>(this,pvVar3,sgn);
        this_local = (RuleWavelet *)((double)phi * dVar6);
      }
      else if (iVar1 == 3) {
        if (0xc < point) {
          sgn = -x;
          phi = (double *)0xbff0000000000000;
          x_local._4_4_ = 0x19 - point;
        }
        pvVar2 = ::std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->data,3);
        pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar2,(long)((x_local._4_4_ + -9) * this->num_data_points));
        dVar6 = interpolate<1>(this,pvVar3,sgn);
        this_local = (RuleWavelet *)((double)phi * dVar6);
      }
      else {
        bVar4 = (byte)iVar1;
        iVar5 = (point + -1) % (1 << (bVar4 & 0x1f));
        local_98 = pow(2.0,(double)(iVar1 + -4));
        if (iVar5 < 5) {
          pvVar2 = ::std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&this->data,4);
          pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar2,(long)(iVar5 * this->num_data_points));
          shift = interpolate<1>(this,pvVar3,local_98 * (x + 1.0) + -1.0);
        }
        else if (((1 << (bVar4 & 0x1f)) + -1) - iVar5 < 5) {
          pvVar2 = ::std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&this->data,4);
          pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar2,(long)((((1 << (bVar4 & 0x1f)) - iVar5) + -1) *
                                           this->num_data_points));
          shift = interpolate<1>(this,pvVar3,local_98 * (1.0 - x) + -1.0);
        }
        else {
          pvVar2 = ::std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&this->data,4);
          pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar2,(long)(this->num_data_points * 5));
          shift = interpolate<1>(this,pvVar3,
                                 (local_98 * (x + 1.0) + -1.0) - (double)(iVar5 + -5) * 0.125);
        }
        if (((1 << (bVar4 & 0x1f)) + -1) - iVar5 < 5) {
          local_98 = -local_98;
        }
        this_local = (RuleWavelet *)(local_98 * shift);
      }
    }
  }
  else {
    this_local = (RuleWavelet *)0x0;
  }
  return (double)this_local;
}

Assistant:

inline double RuleWavelet::eval_cubic(int point, double x) const{
    // Helps stabilize numerical errors.
    if (point == 0 and x == 0.0 and mode == 1) return 0.0;

    // Evaluates a third order wavelet at a given point x.
    double sgn = 1.0;
    if (point < 5){ // Scaling functions
        if (point == 2){ // Reflect across y-axis
            point = 1;
            sgn = -1.0;
            x = -x;
        }else if(point == 4){
            point = 3;
            sgn = -1.0;
            x = -x;
        }
        const double *phi = &(data[1][((point+1)/2) * num_data_points]);
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    int l = Maths::intlog2(point - 1);

    if(l == 2){
        if (point > 6){
            // i.e. 7 or 8
            // These wavelets are reflections across the y-axis of 6 & 5, respectively
            x = -x;
            sgn = -1.0;
            point = 13 - point;
        }
        point -= 5;
        const double *phi = &data[2][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }else if(l == 3){
        if (point > 12){
            // i.e. 13, 14, 15, 16
            // These wavelets are reflections of 12, 11, 10, 9, respectively
            x = -x;
            sgn = -1.0;
            point = 25 - point;
        }
        point -= 9;
        const double *phi = &data[3][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    // Standard lifted wavelets.
    int subindex = (point - 1) % (1 << l);
    double scale = pow(2,l-4);
    double value;
    if (subindex < 5){
        // Left boundary wavelet.
        value = interpolate<mode>(&data[4][subindex*num_data_points], scale * (x + 1.) - 1.);
    } else if ((1 << l) - 1 - subindex < 5){
        // Right boundary wavelet.
        value = interpolate<mode>(&data[4][((1 << l) - subindex - 1)*num_data_points], scale * (1. - x) - 1.);
    } else {
        // Central wavelets.
        double shift = 0.125 * (double (subindex - 5));
        value = interpolate<mode>(&data[4][5*num_data_points], scale * (x + 1.) -1. - shift);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= ((1 << l) - 1 - subindex < 5) ? -scale : scale;

    return value;
}